

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::DropDirectoryItem
          (cmComputeLinkInformation *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          )

{
  cmake *this_00;
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  char *local_20;
  
  this_00 = this->CMakeInstance;
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  local_50 = (psVar1->_M_dataplus)._M_p;
  local_58 = psVar1->_M_string_length;
  local_68._M_len = 8;
  local_68._M_str = "Target \"";
  local_48 = 0x21;
  local_40 = "\" requests linking to directory \"";
  local_30 = (item->Value)._M_dataplus._M_p;
  local_38 = (item->Value)._M_string_length;
  local_28 = 0x44;
  local_20 = "\".  Targets may link only to libraries.  CMake is dropping the item.";
  views._M_len = 5;
  views._M_array = &local_68;
  cmCatViews_abi_cxx11_(&local_88,views);
  cmake::IssueMessage(this_00,WARNING,&local_88,&item->Backtrace);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(BT<std::string> const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  this->CMakeInstance->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Target \"", this->Target->GetName(),
             "\" requests linking to directory \"", item.Value,
             "\".  Targets may link only to libraries.  CMake is dropping "
             "the item."),
    item.Backtrace);
}